

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guha_join_ti_impl.h
# Opt level: O1

void __thiscall
join::
GuhaJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::execute_rsc_join(GuhaJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
                   *this,vector<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
                         *trees_collection,
                  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
                  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_>
                  *join_result,double distance_threshold)

{
  pointer pNVar1;
  pointer pNVar2;
  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *join_result_00;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ub_vectors;
  vector<int,_std::allocator<int>_> reference_set;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  lb_vectors;
  allocator_type local_a2;
  allocator_type local_a1;
  double local_a0;
  vector<double,_std::allocator<double>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<double,_std::allocator<double>_> local_68;
  vector<join::JoinResultElement,_std::allocator<join::JoinResultElement>_> *local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  local_a0 = distance_threshold;
  local_50 = join_result;
  get_reference_set(&local_80,this,trees_collection,distance_threshold);
  pNVar1 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98,
             (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_68);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,((long)pNVar2 - (long)pNVar1 >> 3) * 0x6db6db6db6db6db7,&local_98,&local_a2);
  if (local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pNVar1 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pNVar2 = (trees_collection->
           super__Vector_base<node::Node<label::StringLabel>,_std::allocator<node::Node<label::StringLabel>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_68,
             (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2,(allocator_type *)&local_a2);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)&local_98,((long)pNVar2 - (long)pNVar1 >> 3) * 0x6db6db6db6db6db7,&local_68,&local_a1)
  ;
  join_result_00 = local_50;
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  compute_vectors(this,trees_collection,&local_80,&local_48,
                  (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)&local_98);
  retrieve_metric_candidates
            (this,candidates,join_result_00,local_a0,&local_48,
             (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              *)&local_98);
  retrieve_sc_candidates(this,trees_collection,candidates,join_result_00,local_a0);
  verify_candidates(this,trees_collection,candidates,join_result_00,local_a0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)&local_98);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GuhaJoinTI<Label, VerificationAlgorithm>::execute_rsc_join(
    std::vector<node::Node<Label>>& trees_collection,
    std::vector<std::pair<int, int>>& candidates,
    std::vector<join::JoinResultElement>& join_result,
    const double distance_threshold) {
  
  std::vector<int> reference_set = get_reference_set(
      trees_collection, distance_threshold
  );
  
  std::vector<std::vector<double>> lb_vectors(trees_collection.size(), std::vector<double>(reference_set.size()));
  std::vector<std::vector<double>> ub_vectors(trees_collection.size(), std::vector<double>(reference_set.size()));
  
  // Compute the vectors.
  compute_vectors(trees_collection, reference_set, lb_vectors, ub_vectors);
  
  // Retrieves candidates from the candidate index.
  retrieve_metric_candidates(candidates, join_result, distance_threshold, lb_vectors, ub_vectors);
  retrieve_sc_candidates(trees_collection, candidates, join_result, distance_threshold);

  // Verify all computed join candidates and return the join result.
  verify_candidates(trees_collection, candidates, join_result, distance_threshold);
}